

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::LookAheadResults::setPosition(LookAheadResults *this,int16_t key,int32_t position)

{
  int local_1c;
  int32_t i;
  int32_t position_local;
  int16_t key_local;
  LookAheadResults *this_local;
  
  local_1c = 0;
  while( true ) {
    if (this->fUsedSlotLimit <= local_1c) {
      if (7 < local_1c) {
        local_1c = 7;
      }
      this->fKeys[local_1c] = key;
      this->fPositions[local_1c] = position;
      this->fUsedSlotLimit = local_1c + 1;
      return;
    }
    if (this->fKeys[local_1c] == key) break;
    local_1c = local_1c + 1;
  }
  this->fPositions[local_1c] = position;
  return;
}

Assistant:

void setPosition(int16_t key, int32_t position) {
        int32_t i;
        for (i=0; i<fUsedSlotLimit; ++i) {
            if (fKeys[i] == key) {
                fPositions[i] = position;
                return;
            }
        }
        if (i >= kMaxLookaheads) {
            U_ASSERT(FALSE);
            i = kMaxLookaheads - 1;
        }
        fKeys[i] = key;
        fPositions[i] = position;
        U_ASSERT(fUsedSlotLimit == i);
        fUsedSlotLimit = i + 1;
    }